

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileio.c
# Opt level: O1

FILE * startupfile(char *suffix,char *conffile,char *path,size_t len)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  FILE *local_30;
  FILE *ffp;
  
  pcVar3 = getenv("HOME");
  if ((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) {
    if (conffile == (char *)0x0) {
      if (suffix == (char *)0x0) {
        uVar2 = snprintf(path,len,"%s/.mg",pcVar3);
        if ((int)uVar2 < 0 || len <= uVar2) {
          return (FILE *)0x0;
        }
      }
      else {
        uVar2 = snprintf(path,len,"%s/.mg-%s",pcVar3,suffix);
        if (len <= uVar2 || (int)uVar2 < 0) {
          return (FILE *)0x0;
        }
      }
    }
    else {
      strlcpy(path,conffile,len);
    }
    iVar1 = ffropen((FILE **)&local_30,path,(buffer *)0x0);
    if (iVar1 != 5) {
      if (iVar1 != 0) {
        return (FILE *)0x0;
      }
      return (FILE *)local_30;
    }
    fclose(local_30);
  }
  return (FILE *)0x0;
}

Assistant:

FILE *
startupfile(char *suffix, char *conffile, char *path, size_t len)
{
	FILE		*ffp;
	char		*home;
	int		 ret;

	if ((home = getenv("HOME")) == NULL || *home == '\0')
		goto nohome;

	if (conffile != NULL) {
		(void)strlcpy(path, conffile, len);
	} else if (suffix == NULL) {
		ret = snprintf(path, len, _PATH_MG_STARTUP, home);
		if (ret < 0 || ret >= len)
			return (NULL);
	} else {
		ret = snprintf(path, len, _PATH_MG_TERM, home, suffix);
		if (ret < 0 || ret >= len)
			return (NULL);
	}

	ret = ffropen(&ffp, path, NULL);
	if (ret == FIOSUC)
		return (ffp);
	if (ret == FIODIR)
		(void)ffclose(ffp, NULL);
nohome:
#ifdef STARTUPFILE
	if (suffix == NULL) {
		ret = snprintf(path, len, "%s", STARTUPFILE);
		if (ret < 0 || ret >= len)
			return (NULL);
	} else {
		ret = snprintf(path, len, "%s%s", STARTUPFILE,
		    suffix);
		if (ret < 0 || ret >= len)
			return (NULL);
	}

	ret = ffropen(&ffp, path, NULL);
	if (ret == FIOSUC)
		return (ffp);
	if (ret == FIODIR)
		(void)ffclose(ffp, NULL);
#endif /* STARTUPFILE */
	return (NULL);
}